

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O0

int SetRollPitchMisalignmentPathfinderDVL(PATHFINDERDVL *pPathfinderDVL,double roll,double pitch)

{
  int iVar1;
  size_t sVar2;
  uint8 local_48 [8];
  char buf [32];
  double pitch_local;
  double roll_local;
  PATHFINDERDVL *pPathfinderDVL_local;
  
  buf._24_8_ = pitch;
  sprintf((char *)local_48,"#EI%+06d\r",(ulong)(uint)(int)(roll * 100.0));
  sVar2 = strlen((char *)local_48);
  iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,local_48,(int)sVar2);
  if (iVar1 == 0) {
    if ((pPathfinderDVL->bSaveRawData != 0) && (pPathfinderDVL->pfSaveFile != (FILE *)0x0)) {
      sVar2 = strlen((char *)local_48);
      fwrite(local_48,sVar2,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    sprintf((char *)local_48,"#EJ%+06d\r",(ulong)(uint)(int)((double)buf._24_8_ * 100.0));
    sVar2 = strlen((char *)local_48);
    iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,local_48,(int)sVar2);
    if (iVar1 == 0) {
      if ((pPathfinderDVL->bSaveRawData != 0) && (pPathfinderDVL->pfSaveFile != (FILE *)0x0)) {
        sVar2 = strlen((char *)local_48);
        fwrite(local_48,sVar2,1,(FILE *)pPathfinderDVL->pfSaveFile);
        fflush((FILE *)pPathfinderDVL->pfSaveFile);
      }
      pPathfinderDVL_local._4_4_ = 0;
    }
    else {
      printf("Error writing data to a PathfinderDVL. \n");
      pPathfinderDVL_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a PathfinderDVL. \n");
    pPathfinderDVL_local._4_4_ = 1;
  }
  return pPathfinderDVL_local._4_4_;
}

Assistant:

inline int SetRollPitchMisalignmentPathfinderDVL(PATHFINDERDVL* pPathfinderDVL, double roll, double pitch)
{
	char buf[MAX_NB_BYTES_COMMAND_PATHFINDERDVL];
	
	sprintf(buf, "#EI%+06d\r", (int)(100*roll));

	if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)buf, (int)strlen(buf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a PathfinderDVL. \n");
		return EXIT_FAILURE;
	}
	if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
	{
		fwrite(buf, strlen(buf), 1, pPathfinderDVL->pfSaveFile);
		fflush(pPathfinderDVL->pfSaveFile);
	}
	
	sprintf(buf, "#EJ%+06d\r", (int)(100*pitch));

	if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)buf, (int)strlen(buf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a PathfinderDVL. \n");
		return EXIT_FAILURE;
	}
	if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
	{
		fwrite(buf, strlen(buf), 1, pPathfinderDVL->pfSaveFile);
		fflush(pPathfinderDVL->pfSaveFile);
	}

	return EXIT_SUCCESS;
}